

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMinBase.c
# Opt level: O0

int Abc_NodeSupport(DdNode *bFunc,Vec_Str_t *vSupport,int nVars)

{
  int local_24;
  int local_20;
  int i;
  int Counter;
  int nVars_local;
  Vec_Str_t *vSupport_local;
  DdNode *bFunc_local;
  
  Vec_StrFill(vSupport,nVars,'\0');
  Abc_NodeSupport_rec(bFunc,vSupport);
  Abc_NodeSupportClear_rec(bFunc);
  local_20 = 0;
  for (local_24 = 0; local_24 < nVars; local_24 = local_24 + 1) {
    local_20 = vSupport->pArray[local_24] + local_20;
  }
  return local_20;
}

Assistant:

int Abc_NodeSupport( DdNode * bFunc, Vec_Str_t * vSupport, int nVars )
{
    int Counter, i;
    // compute the support by marking the BDD
    Vec_StrFill( vSupport, nVars, 0 );
    Abc_NodeSupport_rec( bFunc, vSupport );
    // clear the marak
    Abc_NodeSupportClear_rec( bFunc );
    // get the number of support variables
    Counter = 0;
    for ( i = 0; i < nVars; i++ )
        Counter += vSupport->pArray[i];
    return Counter;
}